

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseBase.h
# Opt level: O1

void __thiscall
Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::
swap<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
          (DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>> *this,
          DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *other,
          int param_2)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  
  lVar4 = *(long *)(this + 0x10);
  if (lVar4 == *(long *)(other + 0x10)) {
    if (0 < lVar4) {
      puVar5 = *(undefined8 **)this;
      lVar2 = *(long *)(*(long *)(this + 0x18) + 8);
      puVar6 = *(undefined8 **)other;
      lVar3 = *(long *)(*(long *)(other + 0x18) + 8);
      do {
        uVar1 = *puVar5;
        *puVar5 = *puVar6;
        *puVar6 = uVar1;
        puVar6 = puVar6 + lVar3;
        puVar5 = puVar5 + lVar2;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    return;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/Assign.h"
                ,0x1f2,
                "Derived &Eigen::DenseBase<Eigen::SwapWrapper<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::SwapWrapper<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>, OtherDerived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>]"
               );
}

Assistant:

void swap(const DenseBase<OtherDerived>& other,
              int = OtherDerived::ThisConstantIsPrivateInPlainObjectBase)
    {
      SwapWrapper<Derived>(derived()).lazyAssign(other.derived());
    }